

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary,int fUpdateProfile)

{
  int iVar1;
  Abc_NtkFunc_t AVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Mio_Gate_t **ppMVar11;
  Abc_Obj_t *pAVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  Mio_Gate_t *pMVar16;
  ulong uVar17;
  int iVar18;
  int i;
  ulong uVar19;
  double dVar20;
  double dVar21;
  int local_5c;
  uint local_50;
  uint local_4c;
  
  AVar2 = pNtk->ntkFunc;
  if (AVar2 == ABC_FUNC_MAP && fUseLibrary != 0) {
    uVar4 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar11 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    uVar17 = 0;
    uVar19 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar19 = uVar17;
    }
    for (; uVar19 != uVar17; uVar17 = uVar17 + 1) {
      Mio_GateSetValue(ppMVar11[uVar17],0);
      if (fUpdateProfile != 0) {
        Mio_GateSetProfile2(ppMVar11[uVar17],0);
      }
    }
    local_50 = 0;
    for (iVar18 = 0; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
      pAVar12 = Abc_NtkObj(pNtk,iVar18);
      if ((((pAVar12 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar12->field_0x14 & 0xf) == 7)) &&
          (iVar5 = Abc_ObjIsBarBuf(pAVar12), iVar18 != 0)) && (iVar5 == 0)) {
        pMVar16 = (Mio_Gate_t *)(pAVar12->field_5).pData;
        iVar5 = Mio_GateReadValue(pMVar16);
        Mio_GateSetValue(pMVar16,iVar5 + 1);
        if (fUpdateProfile != 0) {
          Mio_GateIncProfile2((Mio_Gate_t *)(pAVar12->field_5).pData);
        }
        local_50 = local_50 + 1;
        pAVar12 = Abc_NtkFetchTwinNode(pAVar12);
        iVar18 = (iVar18 + 1) - (uint)(pAVar12 == (Abc_Obj_t *)0x0);
      }
    }
    uVar4 = 5;
    for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
      iVar18 = Mio_GateReadValue(ppMVar11[uVar17]);
      uVar6 = uVar4;
      if (iVar18 != 0) {
        pcVar13 = Mio_GateReadName(ppMVar11[uVar17]);
        sVar14 = strlen(pcVar13);
        uVar6 = (uint)sVar14;
        if ((int)(uint)sVar14 < (int)uVar4) {
          uVar6 = uVar4;
        }
      }
      uVar4 = uVar6;
    }
    dVar20 = Abc_NtkGetMappedArea(pNtk);
    local_4c = 0;
    for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
      uVar6 = Mio_GateReadValue(ppMVar11[uVar17]);
      if ((uVar6 != 0) || (iVar18 = Mio_GateReadProfile(ppMVar11[uVar17]), iVar18 != 0)) {
        iVar18 = Mio_GateReadPinNum(ppMVar11[uVar17]);
        if (1 < iVar18) {
          iVar5 = Mio_GateReadProfile(ppMVar11[uVar17]);
          iVar18 = Mio_GateReadProfile2(ppMVar11[uVar17]);
          iVar5 = iVar5 - iVar18;
          iVar18 = -iVar5;
          if (0 < iVar5) {
            iVar18 = iVar5;
          }
          local_4c = local_4c + iVar18;
        }
        dVar21 = Mio_GateReadArea(ppMVar11[uVar17]);
        pcVar13 = Mio_GateReadName(ppMVar11[uVar17]);
        uVar7 = Mio_GateReadPinNum(ppMVar11[uVar17]);
        uVar8 = Mio_GateReadProfile(ppMVar11[uVar17]);
        uVar9 = Mio_GateReadProfile2(ppMVar11[uVar17]);
        pcVar15 = Mio_GateReadForm(ppMVar11[uVar17]);
        printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%   %8d  %8d   %s\n",
               dVar21 * (double)(int)uVar6,(dVar21 * (double)(int)uVar6 * 100.0) / dVar20,
               (ulong)uVar4,pcVar13,(ulong)uVar7,(ulong)uVar6,(ulong)uVar8,(ulong)uVar9,pcVar15);
      }
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%   AbsDiff = %d\n",dVar20,
           0x4059000000000000,(ulong)uVar4,"TOTAL",(ulong)local_50,(ulong)local_4c);
    return;
  }
  bVar3 = true;
  if (AVar2 == ABC_FUNC_BDD) {
    if (pNtk->ntkType == ABC_NTK_LOGIC) {
      iVar18 = Abc_NtkBddToSop(pNtk,-1,1000000000);
      if (iVar18 == 0) {
        puts("Abc_NtkPrintGates(): Converting to SOPs has failed.");
        return;
      }
      bVar3 = false;
    }
  }
  else if ((AVar2 == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    return;
  }
  iVar18 = 0;
  iVar5 = 0;
  iVar1 = 0;
  local_5c = 0;
  uVar6 = 0;
  uVar4 = 0;
  uVar7 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar12 = Abc_NtkObj(pNtk,i);
    if ((((pAVar12 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar12->field_0x14 & 0xf) == 7)) &&
        (iVar10 = Abc_ObjIsBarBuf(pAVar12), i != 0)) && (iVar10 == 0)) {
      pMVar16 = *(Mio_Gate_t **)&(pAVar12->field_5).iData;
      if (pNtk->ntkFunc == ABC_FUNC_MAP) {
        pMVar16 = (Mio_Gate_t *)Mio_GateReadSop(pMVar16);
      }
      iVar10 = Abc_SopIsConst0((char *)pMVar16);
      if ((iVar10 == 0) && (iVar10 = Abc_SopIsConst1((char *)pMVar16), iVar10 == 0)) {
        iVar10 = Abc_SopIsBuf((char *)pMVar16);
        if (iVar10 == 0) {
          iVar10 = Abc_SopIsInv((char *)pMVar16);
          if (iVar10 == 0) {
            iVar10 = Abc_SopIsComplement((char *)pMVar16);
            if (((iVar10 == 0) && (iVar10 = Abc_SopIsAndType((char *)pMVar16), iVar10 != 0)) ||
               ((iVar10 = Abc_SopIsComplement((char *)pMVar16), iVar10 != 0 &&
                (iVar10 = Abc_SopIsOrType((char *)pMVar16), iVar10 != 0)))) {
              iVar5 = iVar5 + 1;
            }
            else {
              iVar10 = Abc_SopIsComplement((char *)pMVar16);
              if (((iVar10 == 0) || (iVar10 = Abc_SopIsAndType((char *)pMVar16), iVar10 == 0)) &&
                 ((iVar10 = Abc_SopIsComplement((char *)pMVar16), iVar10 != 0 ||
                  (iVar10 = Abc_SopIsOrType((char *)pMVar16), iVar10 == 0)))) {
                local_5c = local_5c + 1;
              }
              else {
                iVar1 = iVar1 + 1;
              }
            }
          }
          else {
            iVar18 = iVar18 + 1;
          }
        }
        else {
          uVar4 = uVar4 + 1;
        }
      }
      else {
        uVar7 = uVar7 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  dVar20 = (double)(int)uVar6;
  printf("Const        = %8d    %6.2f %%\n",((double)(int)uVar7 * 100.0) / dVar20,(ulong)uVar7);
  printf("Buffer       = %8d    %6.2f %%\n",((double)(int)uVar4 * 100.0) / dVar20,(ulong)uVar4);
  printf("Inverter     = %8d    %6.2f %%\n",((double)iVar18 * 100.0) / dVar20);
  printf("And          = %8d    %6.2f %%\n",((double)iVar5 * 100.0) / dVar20);
  printf("Or           = %8d    %6.2f %%\n",((double)iVar1 * 100.0) / dVar20);
  printf("Other        = %8d    %6.2f %%\n",((double)local_5c * 100.0) / dVar20);
  printf("TOTAL        = %8d    %6.2f %%\n",(dVar20 * 100.0) / dVar20,(ulong)uVar6);
  if (bVar3) {
    return;
  }
  Abc_NtkSopToBdd(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary, int fUpdateProfile )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal, TotalDiff = 0;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
        {
            Mio_GateSetValue( ppGates[i], 0 );
            if ( fUpdateProfile )
                Mio_GateSetProfile2( ppGates[i], 0 );
        }

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            if ( fUpdateProfile )
                Mio_GateIncProfile2( (Mio_Gate_t *)pObj->pData );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 && Mio_GateReadProfile(ppGates[i]) == 0 )
                continue;
            if ( Mio_GateReadPinNum(ppGates[i]) > 1 )
                TotalDiff += Abc_AbsInt( Mio_GateReadProfile(ppGates[i]) - Mio_GateReadProfile2(ppGates[i]) );
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%   %8d  %8d   %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadProfile(ppGates[i]),
                Mio_GateReadProfile2(ppGates[i]),
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%   AbsDiff = %d\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0, TotalDiff );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}